

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-macros.h
# Opt level: O0

void shift128Left(uint64_t a0,uint64_t a1,int count,uint64_t *z0Ptr,uint64_t *z1Ptr)

{
  byte bVar1;
  undefined8 local_38;
  uint64_t *z1Ptr_local;
  uint64_t *z0Ptr_local;
  int count_local;
  uint64_t a1_local;
  uint64_t a0_local;
  
  bVar1 = (byte)count;
  if (count < 0x40) {
    *z1Ptr = a1 << (bVar1 & 0x3f);
    local_38 = a0;
    if (count != 0) {
      local_38 = a0 << (bVar1 & 0x3f) | a1 >> (-bVar1 & 0x3f);
    }
    *z0Ptr = local_38;
  }
  else {
    *z1Ptr = 0;
    *z0Ptr = a1 << (bVar1 - 0x40 & 0x3f);
  }
  return;
}

Assistant:

static inline void shift128Left(uint64_t a0, uint64_t a1, int count,
                                uint64_t *z0Ptr, uint64_t *z1Ptr)
{
    if (count < 64) {
        *z1Ptr = a1 << count;
        *z0Ptr = count == 0 ? a0 : (a0 << count) | (a1 >> (-count & 63));
    } else {
        *z1Ptr = 0;
        *z0Ptr = a1 << (count - 64);
    }
}